

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

char * onmt::unicode::get_script_name(int script_code)

{
  bool bVar1;
  char *pcVar2;
  int in_EDI;
  pair<const_char_*,_int> *script_info;
  pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *pair;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
  *__range2;
  reference in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
  local_20;
  undefined1 *local_18;
  int local_c;
  
  local_18 = compat_scripts;
  local_c = in_EDI;
  local_20._M_current =
       (pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_> *)
       std::
       vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
       ::begin((vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
                *)in_stack_ffffffffffffffc8);
  std::
  vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
  ::end((vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>
         *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      pcVar2 = (char *)uscript_getName_70(local_c);
      return pcVar2;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
         ::operator*(&local_20);
    if ((in_stack_ffffffffffffffc8->first).second == local_c) break;
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc8;
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<const_char_*,_int>,_std::pair<int,_int>_>_>_>_>
    ::operator++(&local_20);
  }
  return (in_stack_ffffffffffffffc8->first).first;
}

Assistant:

const char* get_script_name(int script_code)
    {
      for (const auto& pair : compat_scripts)
      {
        const auto& script_info = pair.first;
        if (script_info.second == script_code)
          return script_info.first;
      }

      return uscript_getName(static_cast<UScriptCode>(script_code));
    }